

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::internal::TrackEventCategoryRegistry::DisableCategoryForInstance
          (TrackEventCategoryRegistry *this,size_t category_index,uint32_t instance_index)

{
  byte bVar1;
  atomic<unsigned_char> *paVar2;
  bool bVar3;
  byte bStack_5f;
  byte local_34;
  uint32_t instance_index_local;
  size_t category_index_local;
  TrackEventCategoryRegistry *this_local;
  
  paVar2 = this->state_storage_ + category_index;
  local_34 = (byte)instance_index;
  bStack_5f = (paVar2->super___atomic_base<unsigned_char>)._M_i;
  do {
    LOCK();
    bVar1 = (paVar2->super___atomic_base<unsigned_char>)._M_i;
    bVar3 = bStack_5f == bVar1;
    if (bVar3) {
      (paVar2->super___atomic_base<unsigned_char>)._M_i =
           bStack_5f & ~(byte)(1 << (local_34 & 0x1f));
      bVar1 = bStack_5f;
    }
    UNLOCK();
    bStack_5f = bVar1;
  } while (!bVar3);
  return;
}

Assistant:

void TrackEventCategoryRegistry::DisableCategoryForInstance(
    size_t category_index,
    uint32_t instance_index) const {
  PERFETTO_DCHECK(instance_index < kMaxDataSourceInstances);
  PERFETTO_DCHECK(category_index < category_count_);
  // Matches the acquire_load in DataSource::Trace().
  state_storage_[category_index].fetch_and(
      static_cast<uint8_t>(~(1u << instance_index)), std::memory_order_release);
}